

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_SpawnExplosion(FParser *this)

{
  bool bVar1;
  PClassActor *type;
  sector_t_conflict *psVar2;
  AActor *this_00;
  FState *newstate;
  double dVar3;
  double dVar4;
  FSoundID local_68;
  FName local_64;
  svalue_t local_60;
  DVector3 local_48;
  DVector2 local_30;
  DVector2 local_20;
  
  bVar1 = CheckArgs(this,3);
  if (bVar1) {
    svalue_t::svalue_t(&local_60,this->t_argv);
    type = T_GetMobjType(&local_60);
    FString::~FString(&local_60.string);
    if (type != (PClassActor *)0x0) {
      dVar3 = floatvalue(this->t_argv + 1);
      local_48.X = dVar3;
      dVar4 = floatvalue(this->t_argv + 2);
      local_48.Y = dVar4;
      if (this->t_argc < 4) {
        local_20.X = dVar3;
        local_20.Y = dVar4;
        psVar2 = P_PointInSector(&local_20);
        local_30.X = dVar3;
        local_30.Y = dVar4;
        local_48.Z = secplane_t::ZatPoint(&psVar2->floorplane,&local_30);
      }
      else {
        local_48.Z = floatvalue(this->t_argv + 3);
      }
      this_00 = Spawn(type,&local_48,ALLOW_REPLACE);
      (this->t_return).type = 1;
      (this->t_return).value.i = 0;
      if (this_00 != (AActor *)0x0) {
        AActor::ClearCounters(this_00);
        local_64.Index = 0x8c;
        newstate = AActor::FindState(this_00,&local_64);
        bVar1 = AActor::SetState(this_00,newstate,false);
        *(uint *)&(this->t_return).value = (uint)bVar1;
        local_68.ID = (this_00->DeathSound).super_FSoundID.ID;
        if (local_68.ID != 0) {
          S_Sound(this_00,4,&local_68,1.0,1.0);
        }
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_SpawnExplosion()
{
	DVector3 pos;
	AActor*   spawn;
	PClassActor * pclass;
	
	if (CheckArgs(3))
	{
		if (!(pclass=T_GetMobjType(t_argv[0]))) return;
		
		pos.X = floatvalue(t_argv[1]);
		pos.Y = floatvalue(t_argv[2]);
		if(t_argc > 3)
			pos.Z = floatvalue(t_argv[3]);
		else
			pos.Z = P_PointInSector(pos)->floorplane.ZatPoint(pos);
		
		spawn = Spawn (pclass, pos, ALLOW_REPLACE);
		t_return.type = svt_int;
		t_return.value.i=0;
		if (spawn)
		{
			spawn->ClearCounters();
			t_return.value.i = spawn->SetState(spawn->FindState(NAME_Death));
			if(spawn->DeathSound) S_Sound (spawn, CHAN_BODY, spawn->DeathSound, 1, ATTN_NORM);
		}
	}
}